

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O2

int zt_unit_main(zt_unit *unit,int argc,char **argv)

{
  char cVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = 1;
  do {
    if (argc <= lVar4) {
      if (1 < argc) {
        iVar2 = 0;
        for (uVar5 = 1; (uint)argc != uVar5; uVar5 = uVar5 + 1) {
          iVar3 = zt_unit_run_by_name(unit,argv[uVar5]);
          if (iVar3 < 0) {
            printf("Suite or Test \"%s\" not found\n",argv[uVar5]);
            iVar2 = -1;
          }
        }
        if (iVar2 == 0) {
LAB_00104186:
          iVar2 = -(uint)(unit->failures != 0);
        }
        return iVar2;
      }
      zt_unit_run(unit);
      goto LAB_00104186;
    }
    __s1 = argv[lVar4];
    cVar1 = *__s1;
    if ((((cVar1 == '-') && (__s1[1] == 'h')) && (__s1[2] == '\0')) ||
       (iVar2 = strcmp(__s1,"--help"), iVar2 == 0)) {
      printf("%s %s",*argv,
             "[options] <suite | suite.test> ...\n\nOptions:\n     -h, --help               This help text\n     -l, --list               list suites and test (default disabled)\n"
            );
      return 0;
    }
    if (((cVar1 == '-') && (__s1[1] == 'l')) && (__s1[2] == '\0')) break;
    iVar2 = strcmp(__s1,"--list");
    lVar4 = lVar4 + 1;
  } while (iVar2 != 0);
  zt_unit_list(unit);
  return 0;
}

Assistant:

int
zt_unit_main(struct zt_unit    * unit,
             int argc,
             char    * argv[])
{
    int                i;
    int                result = 0;

    char * msg = "[options] <suite | suite.test> ..."NL
                ""NL
                "Options:"NL
                "     -h, --help               This help text"NL
                "     -l, --list               list suites and test (default disabled)"NL;

    for(i=1; i < argc; i++) {
        if(strcmp(argv[i], "-h") == 0 ||
           strcmp(argv[i], "--help") == 0) {
            printf("%s %s", argv[0], msg);
            return 0;
        } else if(strcmp(argv[i], "-l") == 0 ||
                  strcmp(argv[i], "--list") == 0) {
            zt_unit_list(unit);
            return 0;
        }
    }

    if (argc > 1) {
        for (i = 1; i < argc; i++) {
            if (zt_unit_run_by_name(unit, argv[i]) < 0) {
                printf("Suite or Test \"%s\" not found\n", argv[i]);
                result = -1;
            }
        }
    } else {
        if ((result = zt_unit_run(unit)) < 0) {
            return result;
        }
    }

    if (result == 0) {
        if (unit->failures > 0) {
            result = -1;
        }
    }
    return result;
}